

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Skeleton::draw_pick(Skeleton *this,int *pickID,bool transformed)

{
  undefined1 local_68 [8];
  Vector3D meshScale;
  Vector3D meshRot;
  Vector3D meshPos;
  bool transformed_local;
  int *pickID_local;
  Skeleton *this_local;
  
  if (((this->super_SceneObject).isGhosted & 1U) != 0) {
    std::
    map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
    ::clear(&this->idToJoint);
    Vector3D::Vector3D((Vector3D *)&meshRot.z,&(this->mesh->super_SceneObject).position);
    Vector3D::Vector3D((Vector3D *)&meshScale.z,&(this->mesh->super_SceneObject).rotation);
    Vector3D::Vector3D((Vector3D *)local_68,&(this->mesh->super_SceneObject).scale);
    glPushMatrix();
    glTranslated(meshRot.z,meshPos.x,meshPos.y);
    glRotatef((float)meshScale.z,0x3f800000,0);
    glRotatef((float)meshRot.x,0,0x3f800000);
    glRotatef((float)meshRot.y,0,0,0x3f800000);
    glScalef((float)(double)local_68,(float)meshScale.x,(float)meshScale.y);
    drawJoint(this,this->root,pickID,true);
    glPopMatrix();
  }
  return;
}

Assistant:

void Skeleton::draw_pick(int& pickID, bool transformed)
  {
    if (!isGhosted) return;
    idToJoint.clear();
    Vector3D meshPos = mesh->position;
    Vector3D meshRot = mesh->rotation;
    Vector3D meshScale = mesh->scale;

    glPushMatrix();
    glTranslated(meshPos.x, meshPos.y, meshPos.z);
    glRotatef(meshRot.x, 1.0f, 0.0f, 0.0f);
    glRotatef(meshRot.y, 0.0f, 1.0f, 0.0f);
    glRotatef(meshRot.z, 0.0f, 0.0f, 1.0f);
    glScalef(meshScale.x, meshScale.y, meshScale.z);

    drawJoint(root, pickID, true);

    glPopMatrix();
  }